

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

void cpsm::
     str_cat_impl<char_const*,unsigned_long,char_const*,bool,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
               (stringstream *ss,char **x,unsigned_long args,char *args_1,bool args_2,char *args_3,
               unsigned_long args_4,char *args_5,unsigned_long args_6,char *args_7,
               unsigned_long args_8,char *args_9,unsigned_long args_10,char *args_11,
               unsigned_long args_12,char *args_13,unsigned_long args_14,char *args_15,
               unsigned_long args_16)

{
  byte bVar1;
  stringstream *in_RCX;
  unsigned_long unaff_RBP;
  undefined8 *in_RSI;
  long in_RDI;
  byte in_R8B;
  char *in_R9;
  char *unaff_R15;
  char *unaff_retaddr;
  unsigned_long in_stack_00000008;
  char *in_stack_00000010;
  unsigned_long in_stack_00000018;
  char *in_stack_00000020;
  unsigned_long in_stack_00000028;
  char *in_stack_00000030;
  unsigned_long in_stack_00000038;
  char *in_stack_00000040;
  unsigned_long in_stack_00000048;
  undefined8 in_stack_00000068;
  undefined7 in_stack_ffffffffffffffa8;
  
  bVar1 = in_R8B & 1;
  std::operator<<((ostream *)(in_RDI + 0x10),(char *)*in_RSI);
  str_cat_impl<unsigned_long,char_const*,bool,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
            (in_RCX,(unsigned_long *)CONCAT17(bVar1,in_stack_ffffffffffffffa8),in_R9,
             (bool)in_stack_00000068._7_1_,in_stack_00000020,in_stack_00000018,unaff_R15,unaff_RBP,
             unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
             in_stack_00000028,in_stack_00000030,in_stack_00000038,in_stack_00000040,
             in_stack_00000048);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}